

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

bool __thiscall
es32cts::RobustBufferAccessBehavior::ImageLoadStoreTest::verifyValidResults
          (ImageLoadStoreTest *this,GLuint texture_id)

{
  ulong uVar1;
  ostringstream *poVar2;
  TEST_CASES TVar3;
  int iVar4;
  GLenum err;
  undefined4 extraout_var;
  float *pfVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pfVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  vector<float,_std::allocator<float>_> pixels;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  Functions *gl;
  
  iVar4 = (*((this->super_TexelFetchTest).super_TexelFetchTest.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  (*gl->memoryBarrier)(0x20);
  err = (*gl->getError)();
  glu::checkError(err,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                  ,0x414);
  TVar3 = (this->super_TexelFetchTest).super_TexelFetchTest.m_test_case;
  if (TVar3 == R32UI_MIPMAP) {
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pixels,0x400);
    pfVar9 = pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    memset(pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start,0,0x1000);
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,texture_id,1,0x10,0x10,0x8d99,0x1405,pfVar9);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    if (*pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start == 0.0) {
      uVar7 = 0xffffffffffffffff;
      pfVar9 = pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pfVar9 = pfVar9 + 4;
        if (uVar7 == 0xfe) goto LAB_00c9db9c;
        uVar1 = uVar7 + 1;
        uVar8 = uVar7 + 2;
        uVar7 = uVar1;
      } while (uVar8 == (uint)*pfVar9);
      bVar10 = 0xfe < uVar1;
    }
    else {
      bVar10 = false;
    }
    local_1a8._0_8_ =
         ((this->super_TexelFetchTest).super_TexelFetchTest.super_TestCase.m_context)->m_testCtx->
         m_log;
    poVar2 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Invalid value: ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,". Expected value: ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," at offset: ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00c9de77:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
    std::ios_base::~ios_base(local_130);
    pfVar9 = pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      return bVar10;
    }
  }
  else {
    if (TVar3 != RGBA32F) {
      return true;
    }
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize(&pixels,0x400);
    uVar11 = 0;
    uVar12 = 1;
    uVar13 = 2;
    uVar14 = 3;
    lVar6 = 0;
    do {
      fVar18 = (((float)(uVar11 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar11 & 0xffff | 0x4b000000)) * 0.00390625;
      fVar19 = (((float)(uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar12 & 0xffff | 0x4b000000)) * 0.00390625;
      fVar20 = (((float)(uVar13 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar13 & 0xffff | 0x4b000000)) * 0.00390625;
      fVar21 = (((float)(uVar14 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar14 & 0xffff | 0x4b000000)) * 0.00390625;
      pfVar5 = (float *)((long)pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar6 + 0x30);
      *pfVar5 = fVar21;
      pfVar5[1] = fVar21;
      pfVar5[2] = fVar21;
      pfVar5[3] = fVar21;
      pfVar5 = (float *)((long)pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar6 + 0x20);
      *pfVar5 = fVar20;
      pfVar5[1] = fVar20;
      pfVar5[2] = fVar20;
      pfVar5[3] = fVar20;
      pfVar5 = (float *)((long)pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar6 + 0x10);
      *pfVar5 = fVar19;
      pfVar5[1] = fVar19;
      pfVar5[2] = fVar19;
      pfVar5[3] = fVar19;
      pfVar5 = (float *)((long)pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar6);
      *pfVar5 = fVar18;
      pfVar5[1] = fVar18;
      pfVar5[2] = fVar18;
      pfVar5[3] = fVar18;
      uVar11 = uVar11 + 4;
      uVar12 = uVar12 + 4;
      uVar13 = uVar13 + 4;
      uVar14 = uVar14 + 4;
      lVar6 = lVar6 + 0x40;
    } while (lVar6 != 0x1000);
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,texture_id,0,0x10,0x10,0x1908,0x1406,
               pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    pfVar5 = pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 3;
    uVar7 = 0;
    bVar10 = false;
    do {
      fVar17 = (float)((uint)uVar7 & 0xf) * 0.0625;
      fVar16 = (float)((uint)(uVar7 >> 4) & 0xfffffff) * 0.0625;
      fVar15 = (float)(int)(uint)uVar7 * 0.00390625;
      fVar18 = pfVar5[-3];
      fVar19 = pfVar5[-2];
      fVar20 = pfVar5[-1];
      fVar21 = *pfVar5;
      if (((((fVar17 != fVar18) || (NAN(fVar17) || NAN(fVar18))) || (fVar16 != fVar19)) ||
          ((NAN(fVar16) || NAN(fVar19) || (fVar15 != fVar20)))) ||
         ((NAN(fVar15) || NAN(fVar20) || ((fVar21 != 1.0 || (NAN(fVar21))))))) {
        local_1a8._0_8_ =
             ((this->super_TexelFetchTest).super_TexelFetchTest.super_TestCase.m_context)->m_testCtx
             ->m_log;
        poVar2 = (ostringstream *)(local_1a8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Invalid value: ",0xf);
        std::ostream::_M_insert<double>((double)fVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
        std::ostream::_M_insert<double>((double)fVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
        std::ostream::_M_insert<double>((double)fVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
        std::ostream::_M_insert<double>((double)fVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,". Expected value: ",0x12);
        std::ostream::_M_insert<double>((double)fVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
        std::ostream::_M_insert<double>((double)fVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
        std::ostream::_M_insert<double>((double)fVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
        std::ostream::_M_insert<double>(1.0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,". At offset: ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00c9de77;
      }
      bVar10 = 0xfe < uVar7;
      uVar7 = uVar7 + 1;
      pfVar5 = pfVar5 + 4;
    } while (uVar7 != 0x100);
LAB_00c9db9c:
    bVar10 = true;
    pfVar9 = pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  operator_delete(pfVar9,(long)pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage - (long)pfVar9);
  return bVar10;
}

Assistant:

bool ImageLoadStoreTest::verifyValidResults(glw::GLuint texture_id)
{
	static const GLuint height   = 16;
	static const GLuint width	= 16;
	static const GLuint n_pixels = height * width;

	const Functions& gl = m_context.getRenderContext().getFunctions();
	gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

	bool result = true;

	if (RGBA32F == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLfloat> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 1] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 2] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 3] = (GLfloat)i / (GLfloat)n_pixels;
		}

		Texture::GetData(gl, texture_id, 0 /* level */, width, height, GL_RGBA, GL_FLOAT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLfloat expected_red   = (GLfloat)(i % 16) / 16.0f;
			const GLfloat expected_green = (GLfloat)(i / 16) / 16.0f;
			const GLfloat expected_blue  = (GLfloat)i / 256.0f;
			const GLfloat expected_alpha = 1.0f;
			const GLfloat drawn_red		 = pixels[i * n_channels + 0];
			const GLfloat drawn_green	= pixels[i * n_channels + 1];
			const GLfloat drawn_blue	 = pixels[i * n_channels + 2];
			const GLfloat drawn_alpha	= pixels[i * n_channels + 3];

			if ((expected_red != drawn_red) || (expected_green != drawn_green) || (expected_blue != drawn_blue) ||
				(expected_alpha != drawn_alpha))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << drawn_red << ", " << drawn_green << ", "
					<< drawn_blue << ", " << drawn_alpha << ". Expected value: " << expected_red << ", "
					<< expected_green << ", " << expected_blue << ", " << expected_alpha << ". At offset: " << i
					<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels * n_channels; ++i)
		{
			pixels[i] = 0;
		}

		Texture::GetData(gl, texture_id, 1 /* level */, width, height, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = i;
			const GLuint drawn_red	= pixels[i * n_channels];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}

	return result;
}